

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reference_values.cxx
# Opt level: O1

pair<int,_std::vector<double,_std::allocator<double>_>_> *
load_reference_density
          (pair<int,_std::vector<double,_std::allocator<double>_>_> *__return_storage_ptr__,Spin s)

{
  pointer pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  int iVar5;
  vector<double,_std::allocator<double>_> ref_rho;
  vector<double,_std::allocator<double>_> local_38;
  
  pdVar4 = rho_polarized.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar3 = rho_polarized.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = rho.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  pdVar1 = rho.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (s == Polarized) {
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<double_const*,std::back_insert_iterator<std::vector<double,std::allocator<double>>>>
              (rho_polarized.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               rho_polarized.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_38);
    iVar5 = (int)((ulong)((long)pdVar4 - (long)pdVar3) >> 4);
  }
  else {
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<double_const*,std::back_insert_iterator<std::vector<double,std::allocator<double>>>>
              (rho.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               rho.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_38);
    iVar5 = (int)((ulong)((long)pdVar2 - (long)pdVar1) >> 3);
  }
  __return_storage_ptr__->first = iVar5;
  std::vector<double,_std::allocator<double>_>::vector(&__return_storage_ptr__->second,&local_38);
  if (local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<int,std::vector<double>> load_reference_density(ExchCXX::Spin s) {

  std::vector<double> ref_rho;
  int npts;

  if( s == ExchCXX::Spin::Polarized ) {
    npts = rho_polarized.size() / 2;
    copy_iterable( rho_polarized, std::back_inserter(ref_rho) );
  } else {
    npts = rho.size();
    copy_iterable( rho, std::back_inserter(ref_rho) );
  }
  return std::make_pair(npts, ref_rho);

}